

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O1

void __thiscall SceneRender::render(SceneRender *this,Uniforms *_uniforms)

{
  Tracker *this_00;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  Camera *_camera;
  long lVar21;
  Fbo *_fbo;
  size_t _texLoc;
  float *pfVar22;
  long *plVar23;
  _Base_ptr p_Var24;
  size_type *psVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  mat<4,_4,_float,_(glm::qualifier)0> Result;
  undefined1 local_198 [8];
  undefined8 uStack_190;
  undefined1 local_188 [8];
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined8 local_158;
  undefined8 uStack_150;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  size_type local_118;
  undefined8 uStack_110;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  string local_f8;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  undefined8 uStack_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  size_type local_88;
  undefined8 uStack_80;
  string local_78;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  _Rb_tree_node_base *local_38;
  
  renderBackground(this,_uniforms);
  if (this->m_depth_test == true) {
    glEnable(0xb71);
  }
  vera::blendMode(this->m_blend);
  _camera = (_uniforms->super_Scene).activeCamera;
  if (((_camera->super_Node).bChange != false) || ((this->m_origin).bChange == true)) {
    vera::setCamera(_camera);
    vera::applyMatrix(&(this->m_origin).m_transformMatrix);
  }
  this_00 = &_uniforms->tracker;
  if ((_uniforms->tracker).m_running == true) {
    local_198 = (undefined1  [8])local_188;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"render:scene:floor","");
    Tracker::begin(this_00,(string *)local_198);
    if (local_198 != (undefined1  [8])local_188) {
      operator_delete((void *)local_198,(long)local_188 + 1);
    }
  }
  renderFloor(this,_uniforms);
  if ((_uniforms->tracker).m_running == true) {
    local_198 = (undefined1  [8])local_188;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"render:scene:floor","");
    Tracker::end(this_00,(string *)local_198);
    if (local_198 != (undefined1  [8])local_188) {
      operator_delete((void *)local_198,(long)local_188 + 1);
    }
  }
  vera::cullingMode(this->m_culling);
  p_Var24 = (_uniforms->super_Scene).models._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_38 = &(_uniforms->super_Scene).models._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var24 != local_38) {
    do {
      if ((_uniforms->tracker).m_running == true) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_198,"render:scene:",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (*(long *)(p_Var24 + 2) + 0x2b0));
        Tracker::begin(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_198);
        if (local_198 != (undefined1  [8])local_188) {
          operator_delete((void *)local_198,(long)local_188 + 1);
        }
      }
      vera::Shader::use((Shader *)(*(long *)(p_Var24 + 2) + 0x158));
      (*(_uniforms->super_Scene)._vptr_Scene[0x3e])(_uniforms,*(long *)(p_Var24 + 2) + 0x158,1);
      lVar21 = *(long *)(p_Var24 + 2);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,"u_modelViewProjectionMatrix","");
      vera::getProjectionViewWorldMatrix();
      pfVar22 = (float *)(**(code **)(**(long **)(p_Var24 + 2) + 0x100))();
      fVar26 = SUB84(local_78._M_dataplus._M_p,0);
      local_98 = (float)((ulong)local_78._M_dataplus._M_p >> 0x20);
      local_a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_78._M_dataplus._M_p;
      uStack_a0 = 0;
      fVar28 = (float)local_78._M_string_length;
      local_d8 = (float)(local_78._M_string_length >> 0x20);
      fVar29 = (float)local_78.field_2._M_allocated_capacity;
      local_108 = (float)((ulong)local_78.field_2._0_8_ >> 0x20);
      local_118 = local_78.field_2._M_allocated_capacity;
      uStack_110 = 0;
      fVar30 = (float)local_78.field_2._8_8_;
      local_b8 = (float)((ulong)local_78.field_2._8_8_ >> 0x20);
      fVar31 = (float)local_58;
      local_c8 = (float)((ulong)local_58 >> 0x20);
      fVar1 = *pfVar22;
      fVar2 = pfVar22[1];
      fVar3 = pfVar22[2];
      local_88 = local_78._M_string_length;
      uStack_80 = 0;
      local_128 = local_78.field_2._8_8_;
      uStack_120 = 0;
      local_138 = local_58;
      uStack_130 = 0;
      fVar27 = (float)local_50;
      local_148 = (float)((ulong)local_50 >> 0x20);
      local_158 = local_50;
      uStack_150 = 0;
      fVar32 = (float)local_48;
      fVar33 = (float)((ulong)local_48 >> 0x20);
      fVar4 = pfVar22[3];
      fVar34 = (float)local_40;
      fVar35 = (float)((ulong)local_40 >> 0x20);
      fVar5 = pfVar22[4];
      fVar6 = pfVar22[5];
      fVar7 = pfVar22[6];
      fVar8 = pfVar22[7];
      fVar9 = pfVar22[8];
      fVar10 = pfVar22[9];
      fVar11 = pfVar22[10];
      fVar12 = pfVar22[0xb];
      fVar13 = pfVar22[0xc];
      fVar14 = pfVar22[0xd];
      fVar15 = pfVar22[0xe];
      fVar16 = pfVar22[0xf];
      local_198._4_4_ = fVar33 * fVar4 + local_c8 * fVar3 + local_108 * fVar2 + local_98 * fVar1;
      local_198._0_4_ = fVar32 * fVar4 + fVar31 * fVar3 + fVar29 * fVar2 + fVar26 * fVar1;
      uStack_190 = CONCAT44(fVar4 * fVar35 + fVar3 * local_148 + fVar2 * local_b8 + fVar1 * local_d8
                            ,fVar34 * fVar4 + fVar27 * fVar3 + fVar30 * fVar2 + fVar28 * fVar1);
      local_188._4_4_ = fVar33 * fVar8 + local_c8 * fVar7 + local_108 * fVar6 + local_98 * fVar5;
      local_188._0_4_ = fVar32 * fVar8 + fVar31 * fVar7 + fVar29 * fVar6 + fVar26 * fVar5;
      fStack_17c = fVar8 * fVar35 + fVar7 * local_148 + fVar6 * local_b8 + fVar5 * local_d8;
      fStack_180 = fVar34 * fVar8 + fVar27 * fVar7 + fVar30 * fVar6 + fVar28 * fVar5;
      local_178 = fVar32 * fVar12 + fVar31 * fVar11 + fVar29 * fVar10 + fVar26 * fVar9;
      fStack_174 = fVar33 * fVar12 + local_c8 * fVar11 + local_108 * fVar10 + local_98 * fVar9;
      fStack_170 = fVar34 * fVar12 + fVar27 * fVar11 + fVar30 * fVar10 + fVar28 * fVar9;
      fStack_16c = fVar12 * fVar35 + fVar11 * local_148 + fVar10 * local_b8 + fVar9 * local_d8;
      local_168 = fVar32 * fVar16 + fVar31 * fVar15 + fVar29 * fVar14 + fVar26 * fVar13;
      fStack_164 = fVar33 * fVar16 + local_c8 * fVar15 + local_108 * fVar14 + local_98 * fVar13;
      fStack_160 = fVar34 * fVar16 + fVar27 * fVar15 + fVar30 * fVar14 + fVar28 * fVar13;
      fStack_15c = fVar35 * fVar16 + local_148 * fVar15 + local_b8 * fVar14 + local_d8 * fVar13;
      fStack_144 = local_148;
      fStack_140 = local_148;
      fStack_13c = local_148;
      fStack_104 = local_108;
      fStack_100 = local_108;
      fStack_fc = local_108;
      fStack_d4 = local_d8;
      fStack_d0 = local_d8;
      fStack_cc = local_d8;
      fStack_c4 = local_c8;
      fStack_c0 = local_c8;
      fStack_bc = local_c8;
      fStack_b4 = local_b8;
      fStack_b0 = local_b8;
      fStack_ac = local_b8;
      fStack_94 = local_98;
      fStack_90 = local_98;
      fStack_8c = local_98;
      vera::Shader::setUniform((Shader *)(lVar21 + 0x158),&local_f8,(mat4 *)local_198,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      lVar21 = *(long *)(p_Var24 + 2);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"u_modelMatrix","");
      pfVar22 = (float *)(**(code **)(**(long **)(p_Var24 + 2) + 0x100))();
      local_a8._0_4_ = (this->m_origin).m_transformMatrix.value[0].field_0;
      local_a8._4_4_ = (this->m_origin).m_transformMatrix.value[0].field_1;
      uStack_a0 = 0;
      local_88._0_4_ = (this->m_origin).m_transformMatrix.value[0].field_2;
      local_88._4_4_ = (this->m_origin).m_transformMatrix.value[0].field_3;
      local_118._0_4_ = (this->m_origin).m_transformMatrix.value[1].field_0;
      local_118._4_4_ = (this->m_origin).m_transformMatrix.value[1].field_1;
      uStack_110 = 0;
      local_128._0_4_ = (this->m_origin).m_transformMatrix.value[1].field_2;
      local_128._4_4_ = (this->m_origin).m_transformMatrix.value[1].field_3;
      local_138._0_4_ = (this->m_origin).m_transformMatrix.value[2].field_0;
      local_138._4_4_ = (this->m_origin).m_transformMatrix.value[2].field_1;
      fVar1 = *pfVar22;
      fVar2 = pfVar22[1];
      fVar3 = pfVar22[2];
      uStack_80 = 0;
      uStack_120 = 0;
      uStack_130 = 0;
      local_158._0_4_ = (this->m_origin).m_transformMatrix.value[2].field_2;
      local_158._4_4_ = (this->m_origin).m_transformMatrix.value[2].field_3;
      uStack_150 = 0;
      uVar17 = (this->m_origin).m_transformMatrix.value[3].field_0;
      uVar19 = (this->m_origin).m_transformMatrix.value[3].field_1;
      fVar4 = pfVar22[3];
      uVar18 = (this->m_origin).m_transformMatrix.value[3].field_2;
      uVar20 = (this->m_origin).m_transformMatrix.value[3].field_3;
      fVar5 = pfVar22[4];
      fVar6 = pfVar22[5];
      fVar7 = pfVar22[6];
      fVar8 = pfVar22[7];
      fVar9 = pfVar22[8];
      fVar10 = pfVar22[9];
      fVar11 = pfVar22[10];
      fVar12 = pfVar22[0xb];
      fVar13 = pfVar22[0xc];
      fVar14 = pfVar22[0xd];
      fVar15 = pfVar22[0xe];
      fVar16 = pfVar22[0xf];
      local_198._4_4_ =
           (float)uVar19 * fVar4 +
           (float)local_138._4_4_ * fVar3 +
           (float)local_118._4_4_ * fVar2 + (float)local_a8._4_4_ * fVar1;
      local_198._0_4_ =
           (float)uVar17 * fVar4 +
           (float)(undefined4)local_138 * fVar3 +
           (float)(undefined4)local_118 * fVar2 + (float)local_a8._0_4_ * fVar1;
      uStack_190 = CONCAT44(fVar4 * (float)uVar20 +
                            fVar3 * (float)local_158._4_4_ +
                            fVar2 * (float)local_128._4_4_ + fVar1 * (float)local_88._4_4_,
                            (float)uVar18 * fVar4 +
                            (float)(undefined4)local_158 * fVar3 +
                            (float)(undefined4)local_128 * fVar2 +
                            (float)(undefined4)local_88 * fVar1);
      local_188._4_4_ =
           (float)uVar19 * fVar8 +
           (float)local_138._4_4_ * fVar7 +
           (float)local_118._4_4_ * fVar6 + (float)local_a8._4_4_ * fVar5;
      local_188._0_4_ =
           (float)uVar17 * fVar8 +
           (float)(undefined4)local_138 * fVar7 +
           (float)(undefined4)local_118 * fVar6 + (float)local_a8._0_4_ * fVar5;
      fStack_17c = fVar8 * (float)uVar20 +
                   fVar7 * (float)local_158._4_4_ +
                   fVar6 * (float)local_128._4_4_ + fVar5 * (float)local_88._4_4_;
      fStack_180 = (float)uVar18 * fVar8 +
                   (float)(undefined4)local_158 * fVar7 +
                   (float)(undefined4)local_128 * fVar6 + (float)(undefined4)local_88 * fVar5;
      local_178 = (float)uVar17 * fVar12 +
                  (float)(undefined4)local_138 * fVar11 +
                  (float)(undefined4)local_118 * fVar10 + (float)local_a8._0_4_ * fVar9;
      fStack_174 = (float)uVar19 * fVar12 +
                   (float)local_138._4_4_ * fVar11 +
                   (float)local_118._4_4_ * fVar10 + (float)local_a8._4_4_ * fVar9;
      fStack_170 = (float)uVar18 * fVar12 +
                   (float)(undefined4)local_158 * fVar11 +
                   (float)(undefined4)local_128 * fVar10 + (float)(undefined4)local_88 * fVar9;
      fStack_16c = fVar12 * (float)uVar20 +
                   fVar11 * (float)local_158._4_4_ +
                   fVar10 * (float)local_128._4_4_ + fVar9 * (float)local_88._4_4_;
      local_168 = (float)uVar17 * fVar16 +
                  (float)(undefined4)local_138 * fVar15 +
                  (float)(undefined4)local_118 * fVar14 + (float)local_a8._0_4_ * fVar13;
      fStack_164 = (float)uVar19 * fVar16 +
                   (float)local_138._4_4_ * fVar15 +
                   (float)local_118._4_4_ * fVar14 + (float)local_a8._4_4_ * fVar13;
      fStack_160 = (float)uVar18 * fVar16 +
                   (float)(undefined4)local_158 * fVar15 +
                   (float)(undefined4)local_128 * fVar14 + (float)(undefined4)local_88 * fVar13;
      fStack_15c = (float)uVar20 * fVar16 +
                   (float)local_158._4_4_ * fVar15 +
                   (float)local_128._4_4_ * fVar14 + (float)local_88._4_4_ * fVar13;
      local_148 = (float)local_158._4_4_;
      fStack_144 = (float)local_158._4_4_;
      fStack_140 = (float)local_158._4_4_;
      fStack_13c = (float)local_158._4_4_;
      local_108 = (float)local_118._4_4_;
      fStack_104 = (float)local_118._4_4_;
      fStack_100 = (float)local_118._4_4_;
      fStack_fc = (float)local_118._4_4_;
      local_d8 = (float)local_88._4_4_;
      fStack_d4 = (float)local_88._4_4_;
      fStack_d0 = (float)local_88._4_4_;
      fStack_cc = (float)local_88._4_4_;
      local_c8 = (float)local_138._4_4_;
      fStack_c4 = (float)local_138._4_4_;
      fStack_c0 = (float)local_138._4_4_;
      fStack_bc = (float)local_138._4_4_;
      local_b8 = (float)local_128._4_4_;
      fStack_b4 = (float)local_128._4_4_;
      fStack_b0 = (float)local_128._4_4_;
      fStack_ac = (float)local_128._4_4_;
      local_98 = (float)local_a8._4_4_;
      fStack_94 = (float)local_a8._4_4_;
      fStack_90 = (float)local_a8._4_4_;
      fStack_8c = (float)local_a8._4_4_;
      vera::Shader::setUniform((Shader *)(lVar21 + 0x158),&local_78,(mat4 *)local_198,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      lVar21 = *(long *)(p_Var24 + 2);
      local_198 = (undefined1  [8])local_188;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"u_model","");
      vera::Shader::setUniform
                ((Shader *)(lVar21 + 0x158),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                 (this->m_origin).m_position.field_0.x +
                 (this->m_floor).super_Node.m_position.field_0.x,
                 (this->m_origin).m_position.field_1.y +
                 (this->m_floor).super_Node.m_position.field_1.y,
                 (this->m_origin).m_position.field_2.z +
                 (this->m_floor).super_Node.m_position.field_2.z);
      if (local_198 != (undefined1  [8])local_188) {
        operator_delete((void *)local_198,(long)local_188 + 1);
      }
      local_f8._M_dataplus._M_p = (pointer)0x0;
      if ((this->buffersFbo).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (this->buffersFbo).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        do {
          lVar21 = *(long *)(p_Var24 + 2);
          vera::toString<unsigned_long>(&local_78,(unsigned_long *)&local_f8);
          plVar23 = (long *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x2f1d1d);
          psVar25 = (size_type *)(plVar23 + 2);
          if ((size_type *)*plVar23 == psVar25) {
            local_188 = (undefined1  [8])*psVar25;
            _fStack_180 = plVar23[3];
            local_198 = (undefined1  [8])local_188;
          }
          else {
            local_188 = (undefined1  [8])*psVar25;
            local_198 = (undefined1  [8])*plVar23;
          }
          uStack_190 = plVar23[1];
          *plVar23 = (long)psVar25;
          plVar23[1] = 0;
          *(undefined1 *)(plVar23 + 2) = 0;
          _fbo = (this->buffersFbo).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[(long)local_f8._M_dataplus._M_p];
          _texLoc = *(size_t *)(*(long *)(p_Var24 + 2) + 0x198);
          *(size_t *)(*(long *)(p_Var24 + 2) + 0x198) = _texLoc + 1;
          vera::Shader::setUniformTexture
                    ((Shader *)(lVar21 + 0x158),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                     _fbo,_texLoc);
          if (local_198 != (undefined1  [8])local_188) {
            operator_delete((void *)local_198,(long)local_188 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          local_f8._M_dataplus._M_p = local_f8._M_dataplus._M_p + 1;
        } while (local_f8._M_dataplus._M_p <
                 (pointer)((long)(this->buffersFbo).
                                 super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->buffersFbo).
                                 super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3));
      }
      vera::Model::render(*(Model **)(p_Var24 + 2));
      if ((_uniforms->tracker).m_running != false) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_198,"render:scene:",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (*(long *)(p_Var24 + 2) + 0x2b0));
        Tracker::end(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_198);
        if (local_198 != (undefined1  [8])local_188) {
          operator_delete((void *)local_198,(long)local_188 + 1);
        }
      }
      p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24);
    } while (p_Var24 != local_38);
  }
  if ((_uniforms->tracker).m_running != false) {
    local_198 = (undefined1  [8])local_188;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"render:scene:devlook","");
    Tracker::begin(this_00,(string *)local_198);
    if (local_198 != (undefined1  [8])local_188) {
      operator_delete((void *)local_198,(long)local_188 + 1);
    }
  }
  renderDevLook(this,_uniforms);
  if ((_uniforms->tracker).m_running == true) {
    local_198 = (undefined1  [8])local_188;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"render:scene:devlook","");
    Tracker::end(this_00,(string *)local_198);
    if (local_198 != (undefined1  [8])local_188) {
      operator_delete((void *)local_198,(long)local_188 + 1);
    }
  }
  if (this->m_depth_test == true) {
    glDisable(0xb71);
  }
  if (this->m_blend != BLEND_NONE) {
    vera::blendMode(BLEND_ALPHA);
  }
  if (this->m_culling != CULL_NONE) {
    glDisable(0xb44);
  }
  return;
}

Assistant:

void SceneRender::render(Uniforms& _uniforms) {
    // Render Background
    renderBackground(_uniforms);

    // Begining of DEPTH for 3D 
    if (m_depth_test)
        glEnable(GL_DEPTH_TEST);

    vera::blendMode(m_blend);

    if (_uniforms.activeCamera->bChange || m_origin.bChange) {
        vera::setCamera( _uniforms.activeCamera );
        vera::applyMatrix( m_origin.getTransformMatrix() );
    }

    TRACK_BEGIN("render:scene:floor")
    renderFloor(_uniforms );
    TRACK_END("render:scene:floor")

    vera::cullingMode(m_culling);

    for (vera::ModelsMap::iterator it = _uniforms.models.begin(); it != _uniforms.models.end(); ++it) {
        TRACK_BEGIN("render:scene:" + it->second->getName() )

        // bind the shader
        it->second->getShader()->use();

        // Update Uniforms and textures variables to the shader
        _uniforms.feedTo( it->second->getShader(), true, true );

        // Pass special uniforms
        it->second->getShader()->setUniform( "u_modelViewProjectionMatrix", vera::getProjectionViewWorldMatrix() * it->second->getTransformMatrix() );
        it->second->getShader()->setUniform( "u_modelMatrix", m_origin.getTransformMatrix() * it->second->getTransformMatrix() );
        it->second->getShader()->setUniform( "u_model", m_origin.getPosition() + m_floor.getPosition() );

        for (size_t i = 0; i < buffersFbo.size(); i++)
            it->second->getShader()->setUniformTexture("u_sceneBuffer" + vera::toString(i), buffersFbo[i], it->second->getShader()->textureIndex++);

        it->second->render();

        TRACK_END("render:scene:" + it->second->getName() )
    }

    TRACK_BEGIN("render:scene:devlook")
    renderDevLook(_uniforms);
    TRACK_END("render:scene:devlook")

    if (m_depth_test)
        glDisable(GL_DEPTH_TEST);

    if (m_blend != 0)
        vera::blendMode(vera::BLEND_ALPHA);

    if (m_culling != 0)
        glDisable(GL_CULL_FACE);
}